

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall amrex::MLCellLinOp::defineBC(MLCellLinOp *this)

{
  int iVar1;
  pointer puVar2;
  tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_> tVar3;
  pointer puVar4;
  tuple<amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_> tVar5;
  __uniq_ptr_data<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>,_true,_true> _Var6;
  Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  *pVVar7;
  pointer paVar8;
  undefined8 uVar9;
  ulong uVar10;
  MLCellLinOp *pMVar11;
  int amrlev_2;
  int amrlev;
  long lVar12;
  int amrlev_1;
  long lVar13;
  long lVar14;
  long lVar15;
  int ncomp;
  MLCellLinOp *local_210;
  int out_rad;
  int extent_rad;
  Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  *local_200;
  int in_rad;
  Real RStack_1f0;
  Real local_1e8;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  bclohi;
  BoxArray cba;
  
  ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  std::
  vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  ::resize(&(this->m_bndry_sol).
            super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  std::
  vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  ::resize(&(this->m_crse_sol_br).
            super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  std::
  vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  ::resize(&(this->m_bndry_cor).
            super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  local_200 = &this->m_crse_cor_br;
  std::
  vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  ::resize(&local_200->
            super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  local_210 = this;
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::resize(&(this->m_robin_bcval).
            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  lVar13 = 0;
  lVar12 = 0;
  while( true ) {
    pMVar11 = local_210;
    uVar10 = (ulong)(local_210->super_MLLinOp).m_num_amr_levels;
    if ((long)uVar10 <= lVar12) break;
    std::
    make_unique<amrex::MLMGBndry,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,amrex::Geometry&>
              (&cba,*(DistributionMapping **)
                     ((long)&(((local_210->super_MLLinOp).m_grids.
                               super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar13),
               *(int **)((long)&(((local_210->super_MLLinOp).m_dmap.
                                  super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                ).
                                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar13),
               (Geometry *)&ncomp);
    uVar9 = cba.m_bat._0_8_;
    puVar2 = (pMVar11->m_bndry_sol).
             super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    cba.m_bat._0_8_ = 0;
    tVar3.super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
    super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_> *)
          &puVar2[lVar12]._M_t.
           super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>;
    puVar2[lVar12]._M_t.
    super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> =
         (__uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>)uVar9;
    if (tVar3.super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
        super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MLMGBndry_*,_false>)0x0) {
      (**(code **)(*(long *)tVar3.
                            super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                            .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl + 8))();
    }
    if (cba.m_bat._0_8_ != 0) {
      (**(code **)(*(long *)cba.m_bat._0_8_ + 8))();
    }
    lVar12 = lVar12 + 1;
    lVar13 = lVar13 + 0x18;
  }
  lVar13 = 3;
  for (lVar12 = 1; pVVar7 = local_200, pMVar11 = local_210, lVar12 < (int)uVar10;
      lVar12 = lVar12 + 1) {
    _in_rad = (undefined **)((ulong)_in_rad & 0xffffffff00000000);
    out_rad = 1;
    extent_rad = 2;
    iVar1 = (local_210->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar12 + -1];
    BoxArray::BoxArray(&cba,(&(((local_210->super_MLLinOp).m_grids.
                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_start)[lVar13]);
    BoxArray::coarsen(&cba,iVar1);
    std::
    make_unique<amrex::BndryRegister,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,int_const&,int_const&>
              ((BoxArray *)&bclohi,(DistributionMapping *)&cba,
               (int *)(&(((pMVar11->super_MLLinOp).m_dmap.
                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ).
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start)[lVar13],&in_rad,&out_rad,
               &extent_rad);
    paVar8 = bclohi.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->m_crse_sol_br).
             super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bclohi.
    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    .
    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tVar5.super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
    .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_> *)
          &puVar4[lVar12]._M_t.
           super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>;
    puVar4[lVar12]._M_t.
    super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> =
         (__uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>)paVar8;
    if (tVar5.
        super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>.
        super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::BndryRegister_*,_false>)0x0) {
      (**(code **)(*(long *)tVar5.
                            super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
                            .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl + 8))
                ();
    }
    if (bclohi.
        super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        .
        super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(bclohi.
                             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                             .
                             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 8))();
    }
    BoxArray::~BoxArray(&cba);
    uVar10 = (ulong)(uint)(local_210->super_MLLinOp).m_num_amr_levels;
    lVar13 = lVar13 + 3;
  }
  lVar13 = 3;
  for (lVar12 = 1; lVar12 < (int)uVar10; lVar12 = lVar12 + 1) {
    _in_rad = (undefined **)((ulong)_in_rad & 0xffffffff00000000);
    out_rad = 1;
    extent_rad = 2;
    iVar1 = (pMVar11->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar12 + -1];
    BoxArray::BoxArray(&cba,(&(((pMVar11->super_MLLinOp).m_grids.
                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_start)[lVar13]);
    BoxArray::coarsen(&cba,iVar1);
    std::
    make_unique<amrex::BndryRegister,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,int_const&,int_const&>
              ((BoxArray *)&bclohi,(DistributionMapping *)&cba,
               (int *)(&(((pMVar11->super_MLLinOp).m_dmap.
                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ).
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start)[lVar13],&in_rad,&out_rad,
               &extent_rad);
    paVar8 = bclohi.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (pVVar7->
             super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bclohi.
    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    .
    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tVar5.super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
    .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_> *)
          &puVar4[lVar12]._M_t.
           super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>;
    puVar4[lVar12]._M_t.
    super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> =
         (__uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>)paVar8;
    if (tVar5.
        super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>.
        super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::BndryRegister_*,_false>)0x0) {
      (**(code **)(*(long *)tVar5.
                            super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
                            .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl + 8))
                ();
    }
    if (bclohi.
        super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        .
        super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(bclohi.
                             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                             .
                             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 8))();
    }
    BndryRegister::setVal
              ((BndryRegister *)
               (pVVar7->
               super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
               super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
               ,0.0);
    pMVar11 = local_210;
    BoxArray::~BoxArray(&cba);
    uVar10 = (ulong)(uint)(pMVar11->super_MLLinOp).m_num_amr_levels;
    lVar13 = lVar13 + 3;
  }
  lVar13 = 3;
  for (lVar12 = 1; lVar12 < (int)uVar10; lVar12 = lVar12 + 1) {
    std::
    make_unique<amrex::MLMGBndry,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,amrex::Geometry&>
              (&cba,(DistributionMapping *)
                    (&(((pMVar11->super_MLLinOp).m_grids.
                        super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start)[lVar13],
               (int *)(&(((pMVar11->super_MLLinOp).m_dmap.
                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ).
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start)[lVar13],(Geometry *)&ncomp);
    uVar9 = cba.m_bat._0_8_;
    puVar2 = (pMVar11->m_bndry_cor).
             super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    cba.m_bat._0_8_ = 0;
    tVar3.super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
    super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_> *)
          &puVar2[lVar12]._M_t.
           super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>;
    puVar2[lVar12]._M_t.
    super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> =
         (__uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>)uVar9;
    if (tVar3.super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
        super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MLMGBndry_*,_false>)0x0) {
      (**(code **)(*(long *)tVar3.
                            super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                            .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl + 8))();
    }
    if (cba.m_bat._0_8_ != 0) {
      (**(code **)(*(long *)cba.m_bat._0_8_ + 8))();
    }
    bclohi.
    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    .
    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    bclohi.
    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    .
    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bclohi.
    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    .
    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _in_rad = &PTR__FabFactory_006d8928;
    MultiFab::MultiFab((MultiFab *)&cba,
                       (&(((local_210->super_MLLinOp).m_grids.
                           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start)[lVar13],
                       (&(((local_210->super_MLLinOp).m_dmap.
                           super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         ).
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         ._M_impl.super__Vector_impl_data._M_start)[lVar13],ncomp,1,
                       (MFInfo *)&bclohi,(FabFactory<amrex::FArrayBox> *)&in_rad);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&bclohi.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>((FabArray<amrex::FArrayBox> *)&cba,0.0);
    _Var6.super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
    super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
         (local_210->m_bndry_cor).
         super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
         super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>;
    bclohi.
    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    .
    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0xfffffd66fffffd66;
    bclohi.
    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    .
    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xfffffd66fffffd66;
    bclohi.
    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    .
    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xfffffd66fffffd66;
    (**(code **)(*(long *)_Var6.
                          super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                          .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl + 0x38))
              (_Var6.super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
               super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl,
               (tuple<amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>)
               (local_210->m_crse_cor_br).
               super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
               super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
               ,0,(FabArray<amrex::FArrayBox> *)&cba,0,0,ncomp,
               (local_210->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar12 + -1],
               (_Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)&bclohi,InterpBndryData::IBD_max_order_DEF);
    _in_rad = (_func_int **)0x6500000065;
    RStack_1f0 = (Real)CONCAT44(RStack_1f0._4_4_,0x65);
    std::
    vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)&bclohi,(long)ncomp,(value_type *)&in_rad,(allocator_type *)&out_rad);
    pMVar11 = local_210;
    _in_rad = (_func_int **)0x0;
    RStack_1f0 = 0.0;
    local_1e8 = 0.0;
    MLMGBndry::setLOBndryConds
              ((MLMGBndry *)
               (local_210->m_bndry_cor).
               super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
               super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,
               &bclohi,&bclohi,
               (local_210->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar12 + -1],(RealVect *)&in_rad);
    std::
    _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                     *)&bclohi);
    MultiFab::~MultiFab((MultiFab *)&cba);
    uVar10 = (ulong)(uint)(pMVar11->super_MLLinOp).m_num_amr_levels;
    lVar13 = lVar13 + 3;
  }
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
  ::resize(&(local_210->m_bcondloc).
            super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
           ,(long)(int)uVar10);
  pMVar11 = local_210;
  for (local_210 = (MLCellLinOp *)0x0;
      (long)local_210 < (long)(pMVar11->super_MLLinOp).m_num_amr_levels;
      local_210 = (MLCellLinOp *)((long)local_210 + 1)) {
    local_200 = (Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                 *)((long)local_210 * 0x18);
    std::
    vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
    ::resize(&(pMVar11->m_bcondloc).
              super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
              .
              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)local_210].
              super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
             ,(long)(pMVar11->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>
                    .super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[(long)local_210]);
    lVar15 = 0;
    lVar13 = 0;
    lVar12 = 0;
    for (lVar14 = 0; pVVar7 = local_200,
        lVar14 < (pMVar11->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[(long)local_210]; lVar14 = lVar14 + 1) {
      std::
      make_unique<amrex::MLCellLinOp::BndryCondLoc,amrex::BoxArray&,amrex::DistributionMapping&,int_const&>
                (&cba,(DistributionMapping *)
                      (*(long *)((long)&(((pMVar11->super_MLLinOp).m_grids.
                                          super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                          .
                                          super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                        ).
                                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                        ._M_impl.super__Vector_impl_data._M_start + (long)local_200)
                      + lVar12),
                 (int *)(*(long *)((long)&(((pMVar11->super_MLLinOp).m_dmap.
                                            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                            .
                                            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                          ).
                                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (long)local_200) + lVar13));
      uVar9 = cba.m_bat._0_8_;
      cba.m_bat._0_8_ = 0;
      std::
      __uniq_ptr_impl<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
      ::reset((__uniq_ptr_impl<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
               *)(*(long *)((long)&(((pMVar11->m_bcondloc).
                                     super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                   ).
                                   super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (long)pVVar7) +
                 lVar15),(pointer)uVar9);
      std::
      unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
      ::~unique_ptr((unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                     *)&cba);
      lVar12 = lVar12 + 0x68;
      lVar13 = lVar13 + 0x10;
      lVar15 = lVar15 + 8;
    }
  }
  return;
}

Assistant:

void
MLCellLinOp::defineBC ()
{
    BL_PROFILE("MLCellLinOp::defineBC()");

    const int ncomp = getNComp();

    m_bndry_sol.resize(m_num_amr_levels);
    m_crse_sol_br.resize(m_num_amr_levels);

    m_bndry_cor.resize(m_num_amr_levels);
    m_crse_cor_br.resize(m_num_amr_levels);

    m_robin_bcval.resize(m_num_amr_levels);

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_bndry_sol[amrlev] = std::make_unique<MLMGBndry>(m_grids[amrlev][0], m_dmap[amrlev][0],
                                                          ncomp, m_geom[amrlev][0]);
    }

    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        const int in_rad = 0;
        const int out_rad = 1;
        const int extent_rad = 2;
        const int crse_ratio = m_amr_ref_ratio[amrlev-1];
        BoxArray cba = m_grids[amrlev][0];
        cba.coarsen(crse_ratio);
        m_crse_sol_br[amrlev] = std::make_unique<BndryRegister>
            (cba, m_dmap[amrlev][0], in_rad, out_rad, extent_rad, ncomp);
    }

    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        const int in_rad = 0;
        const int out_rad = 1;
        const int extent_rad = 2;
        const int crse_ratio = m_amr_ref_ratio[amrlev-1];
        BoxArray cba = m_grids[amrlev][0];
        cba.coarsen(crse_ratio);
        m_crse_cor_br[amrlev] = std::make_unique<BndryRegister>
            (cba, m_dmap[amrlev][0], in_rad, out_rad, extent_rad, ncomp);
        m_crse_cor_br[amrlev]->setVal(0.0);
    }

    // This has be to done after m_crse_cor_br is defined.
    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_bndry_cor[amrlev] = std::make_unique<MLMGBndry>(m_grids[amrlev][0], m_dmap[amrlev][0],
                                                          ncomp, m_geom[amrlev][0]);
        MultiFab bc_data(m_grids[amrlev][0], m_dmap[amrlev][0], ncomp, 1);
        bc_data.setVal(0.0);

        m_bndry_cor[amrlev]->setBndryValues(*m_crse_cor_br[amrlev], 0, bc_data, 0, 0, ncomp,
                                            m_amr_ref_ratio[amrlev-1], BCRec());

        Vector<Array<LinOpBCType,AMREX_SPACEDIM> > bclohi
            (ncomp,Array<LinOpBCType,AMREX_SPACEDIM>{{AMREX_D_DECL(BCType::Dirichlet,
                                                                   BCType::Dirichlet,
                                                                   BCType::Dirichlet)}});
        m_bndry_cor[amrlev]->setLOBndryConds(bclohi, bclohi, m_amr_ref_ratio[amrlev-1], RealVect{});
    }

    m_bcondloc.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_bcondloc[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_bcondloc[amrlev][mglev] = std::make_unique<BndryCondLoc>(m_grids[amrlev][mglev],
                                                                       m_dmap[amrlev][mglev],
                                                                       ncomp);
        }
    }
}